

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O1

void __thiscall
mapbox::detail::Earcut<unsigned_int>::indexCurve(Earcut<unsigned_int> *this,Node *start)

{
  Node *list;
  int iVar1;
  Node *pNVar2;
  
  pNVar2 = start;
  do {
    iVar1 = pNVar2->z;
    if (iVar1 == 0) {
      iVar1 = zOrder(this,pNVar2->x,pNVar2->y);
    }
    pNVar2->z = iVar1;
    list = pNVar2->next;
    pNVar2->prevZ = pNVar2->prev;
    pNVar2->nextZ = list;
    pNVar2 = list;
  } while (list != start);
  list->prevZ->nextZ = (Node *)0x0;
  list->prevZ = (Node *)0x0;
  sortLinked(this,list);
  return;
}

Assistant:

void Earcut<N>::indexCurve(Node* start) {
    assert(start);
    Node* p = start;

    do {
        p->z = p->z ? p->z : zOrder(p->x, p->y);
        p->prevZ = p->prev;
        p->nextZ = p->next;
        p = p->next;
    } while (p != start);

    p->prevZ->nextZ = nullptr;
    p->prevZ = nullptr;

    sortLinked(p);
}